

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_check::test_method(util_check *this)

{
  int iVar1;
  bool bVar2;
  type piVar3;
  bool *pbVar4;
  NoCopyOrMove *pNVar5;
  int *piVar6;
  long in_FS_OFFSET;
  int two;
  int nine;
  NoCopyOrMove x;
  bool result;
  unique_ptr<int,_std::default_delete<int>_> p_two;
  char *in_stack_fffffffffffffe38;
  lazy_ostream *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  bool *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  lazy_ostream *in_stack_fffffffffffffe68;
  const_string *in_stack_fffffffffffffe70;
  const_string *file;
  unique_ptr<int,_std::default_delete<int>_> *in_stack_fffffffffffffe78;
  optional<int> *val;
  undefined4 local_e4;
  undefined1 local_e0 [16];
  undefined1 local_d0 [64];
  undefined4 local_90;
  undefined1 local_8c [8];
  int local_84;
  undefined1 local_80 [16];
  undefined1 local_70 [72];
  undefined1 local_28;
  byte local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined4 local_24;
  optional<int> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 2;
  std::make_unique<int,int>((int *)in_stack_fffffffffffffe40);
  inline_assertion_check<true,std::unique_ptr<int,std::default_delete<int>>>
            (in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  std::unique_ptr<int,_std::default_delete<int>_>::unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)in_stack_fffffffffffffe38,
             (unique_ptr<int,_std::default_delete<int>_> *)0xc050ba);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)in_stack_fffffffffffffe48);
  inline_assertion_check<true,std::unique_ptr<int,std::default_delete<int>>const&>
            (in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  piVar3 = std::unique_ptr<int,_std::default_delete<int>_>::operator*
                     ((unique_ptr<int,_std::default_delete<int>_> *)in_stack_fffffffffffffe48);
  iVar1 = *piVar3;
  local_25 = iVar1 == 2;
  inline_assertion_check<true,bool>
            ((bool *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  local_26 = 1;
  inline_assertion_check<true,bool>
            ((bool *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  local_28 = iVar1 == 2;
  pbVar4 = inline_assertion_check<false,bool>
                     (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                      (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                      (char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_27 = *pbVar4 & 1;
  inline_assertion_check<true,bool_const&>
            ((bool *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  anon_unknown_3::NoCopyOrMove::NoCopyOrMove((NoCopyOrMove *)in_stack_fffffffffffffe38,0);
  pNVar5 = inline_assertion_check<true,util_tests::(anonymous_namespace)::NoCopyOrMove&>
                     ((NoCopyOrMove *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                      (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                      (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                      in_stack_fffffffffffffe58);
  pNVar5->i = pNVar5->i + 3;
  inline_assertion_check<true,util_tests::(anonymous_namespace)::NoCopyOrMove&>
            ((NoCopyOrMove *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  anon_unknown_3::NoCopyOrMove::test((NoCopyOrMove *)in_stack_fffffffffffffe48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               (size_t)in_stack_fffffffffffffe68,
               (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe40,(char (*) [1])in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38);
    inline_assertion_check<true,util_tests::(anonymous_namespace)::NoCopyOrMove&>
              ((NoCopyOrMove *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
               (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    bVar2 = anon_unknown_3::NoCopyOrMove::test((NoCopyOrMove *)in_stack_fffffffffffffe48);
    local_84 = (uint)bVar2 * 3;
    piVar6 = inline_assertion_check<true,int>
                       ((int *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                        (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                        (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58);
    local_8c._4_4_ = 3;
    in_stack_fffffffffffffe48 = "3";
    in_stack_fffffffffffffe40 = (lazy_ostream *)(local_8c + 4);
    in_stack_fffffffffffffe38 =
         "inline_assertion_check<true>((inline_assertion_check<true>(x, \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp\", 112, __func__, \"x\").test() ? 3 : 0), \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp\", 112, __func__, \"(Assert(x).test() ? 3 : 0)\")"
    ;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_70,local_80,0x70,1,2,piVar6);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_90 = 9;
  val = &local_10;
  std::optional<int>::optional<int,_true>
            ((optional<int> *)in_stack_fffffffffffffe48,(int *)in_stack_fffffffffffffe40);
  inline_assertion_check<true,std::optional<int>>
            (val,(char *)in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  piVar6 = std::optional<int>::operator*((optional<int> *)in_stack_fffffffffffffe38);
  local_8c._0_4_ = *piVar6;
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)val,file,(size_t)in_stack_fffffffffffffe68,
               (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    in_stack_fffffffffffffe68 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe40,(char (*) [1])in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
               (pointer)in_stack_fffffffffffffe40,(unsigned_long)in_stack_fffffffffffffe38);
    local_e4 = 9;
    in_stack_fffffffffffffe48 = "nine";
    in_stack_fffffffffffffe40 = (lazy_ostream *)local_8c;
    in_stack_fffffffffffffe38 = "9";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_d0,local_e0,0x75,1,2,&local_e4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe67 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe67);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_check)
{
    // Check that Assert can forward
    const std::unique_ptr<int> p_two = Assert(std::make_unique<int>(2));
    // Check that Assert works on lvalues and rvalues
    const int two = *Assert(p_two);
    Assert(two == 2);
    Assert(true);
    // Check that Assume can be used as unary expression
    const bool result{Assume(two == 2)};
    Assert(result);

    // Check that Assert doesn't require copy/move
    NoCopyOrMove x{9};
    Assert(x).i += 3;
    Assert(x).test();

    // Check nested Asserts
    BOOST_CHECK_EQUAL(Assert((Assert(x).test() ? 3 : 0)), 3);

    // Check -Wdangling-gsl does not trigger when copying the int. (It would
    // trigger on "const int&")
    const int nine{*Assert(std::optional<int>{9})};
    BOOST_CHECK_EQUAL(9, nine);
}